

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O3

void __thiscall
ot::commissioner::UdpSocket::SetEventHandler(UdpSocket *this,EventHandler *aEventHandler)

{
  EventHandler *pEVar1;
  void *pvVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  _Any_data __tmp;
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type local_60;
  UdpSocket *local_50;
  _Any_data local_48;
  code *local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  local_50 = this;
  std::function<void_(short)>::function((function<void_(short)> *)&local_48,aEventHandler);
  local_78._8_8_ = 0;
  puVar4 = (undefined8 *)operator_new(0x28);
  pEVar1 = &(this->super_Socket).mEventHandler;
  *puVar4 = local_50;
  puVar4[1] = 0;
  puVar4[2] = 0;
  puVar4[3] = 0;
  puVar4[4] = uStack_30;
  if (local_38 != (code *)0x0) {
    puVar4[1] = local_48._M_unused._M_object;
    puVar4[2] = local_48._8_8_;
    puVar4[3] = local_38;
    local_38 = (code *)0x0;
    uStack_30 = 0;
  }
  local_78._0_4_ = SUB84(puVar4,0);
  local_78._4_4_ = (undefined4)((ulong)puVar4 >> 0x20);
  local_28 = local_78._0_4_;
  uStack_24 = local_78._4_4_;
  uStack_20 = local_78._8_4_;
  uStack_1c = local_78._12_4_;
  pvVar2 = *(void **)&(pEVar1->super__Function_base)._M_functor;
  uVar3 = *(undefined8 *)
           ((long)&(this->super_Socket).mEventHandler.super__Function_base._M_functor + 8);
  *(undefined4 *)&(pEVar1->super__Function_base)._M_functor = local_78._0_4_;
  *(undefined4 *)((long)&(this->super_Socket).mEventHandler.super__Function_base._M_functor + 4) =
       local_78._4_4_;
  *(undefined4 *)((long)&(this->super_Socket).mEventHandler.super__Function_base._M_functor + 8) =
       local_78._8_4_;
  *(undefined4 *)((long)&(this->super_Socket).mEventHandler.super__Function_base._M_functor + 0xc) =
       local_78._12_4_;
  local_68 = (this->super_Socket).mEventHandler.super__Function_base._M_manager;
  (this->super_Socket).mEventHandler.super__Function_base._M_manager =
       std::
       _Function_handler<void_(short),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket.cpp:258:21)>
       ::_M_manager;
  local_60 = (this->super_Socket).mEventHandler._M_invoker;
  (this->super_Socket).mEventHandler._M_invoker =
       std::
       _Function_handler<void_(short),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket.cpp:258:21)>
       ::_M_invoke;
  if (local_68 != (_Manager_type)0x0) {
    local_78._M_unused._M_object = pvVar2;
    local_78._8_8_ = uVar3;
    (*local_68)(&local_78,&local_78,__destroy_functor);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
  }
  return;
}

Assistant:

void UdpSocket::SetEventHandler(EventHandler aEventHandler)
{
    mEventHandler = [this, aEventHandler](short aFlags) {
        if (mIsBound && !mIsConnected && (aFlags & EV_READ))
        {
            mbedtls_net_context connectedCtx;
            mbedtls_net_init(&connectedCtx);

            // This will get 'mNetCtx' connected and returned as 'connectCtx'.
            int rval = mbedtls_net_accept(&mNetCtx, &connectedCtx, nullptr, 0, nullptr);
            if (rval != 0)
            {
                LOG_INFO(LOG_REGION_SOCKET, "UDP socket(={}) accept new connection failed: {}",
                         static_cast<void *>(this), rval);
            }
            else
            {
                mbedtls_net_free(&mNetCtx);

                // We know that 'connectedCtx' has the same fd as the original 'mNetCtx' before accept.
                mNetCtx      = connectedCtx;
                mIsConnected = true;
            }
        }

        // Do not handle event unless the socket is connected.
        if (mIsConnected)
        {
            aEventHandler(aFlags);
        }
    };
}